

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O3

TestStatus *
vkt::pipeline::anon_unknown_0::SampledImage::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  void **this;
  VkSampleCountFlagBits VVar1;
  VkSubpassDescription *pVVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  undefined8 uVar4;
  VkShaderModule fragmentModule;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  IVec2 renderSize;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  VkCommandBuffer commandBuffer;
  deUint32 queueFamilyIndex;
  int iVar8;
  VkResult result;
  anon_unknown_0 *this_00;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  TestLog *pTVar9;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  const_iterator cVar10;
  int iVar11;
  int iVar12;
  VkDeviceSize bufferSize;
  VkDeviceSize bufferSize_00;
  TestStatus *pTVar13;
  undefined4 uVar14;
  undefined1 local_678 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  TestStatus *local_650;
  long *local_648;
  long *local_640;
  long *local_638;
  Context *local_630;
  undefined1 local_628 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  VkAttachmentReference colorAttachmentRef;
  long local_5e0;
  long local_5d8 [2];
  Move<vk::Handle<(vk::HandleType)17>_> local_5c8;
  VkBufferCreateInfo bufferCreateInfo;
  ios_base local_530 [264];
  long local_428;
  long *plStack_420;
  VkBufferCreateFlags local_418;
  undefined4 uStack_414;
  VkDeviceSize VStack_410;
  VkImage local_408;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_400;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  VkPipelineLayout local_3a8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_3a0;
  VkDescriptorSetLayout local_388;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_380;
  VkBuffer local_368;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_360;
  VkSubpassDescription *local_348;
  VkQueue local_340;
  VkBuffer local_338;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_330;
  VkCommandBuffer local_318;
  long *plStack_310;
  VkBufferCreateFlags local_308;
  undefined4 uStack_304;
  VkDeviceSize VStack_300;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_2b0;
  VkRenderPass local_298;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_290;
  VkDescriptorPool local_278;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_270;
  VkImageView local_258;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_250;
  VkSampler local_238;
  Deleter<vk::Handle<(vk::HandleType)20>_> DStack_230;
  VkImageView local_218;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_210;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  VkDescriptorImageInfo imageDescriptorInfo;
  undefined1 local_1c8 [8];
  pointer pVStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined8 local_1a8;
  VkSubpassDescription *local_1a0;
  deUint32 local_198;
  VkSubpassDependency *local_190;
  ios_base local_150 [264];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_650 = __return_storage_ptr__;
  this_00 = (anon_unknown_0 *)Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  local_340 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  checkImageFormatRequirements(vki,physDevice,caseDef->numSamples,caseDef->colorFormat,0x14);
  pTVar9 = context->m_testCtx->m_log;
  local_678._0_8_ = &local_668;
  local_630 = context;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"Description","");
  local_628._0_8_ = &local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
  tcu::LogSection::LogSection((LogSection *)local_3e8,(string *)local_678,(string *)local_628);
  tcu::TestLog::startSection(pTVar9,(char *)local_3e8._0_8_,(char *)CONCAT44(uStack_3c4,local_3c8));
  local_1c8 = (undefined1  [8])pTVar9;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pVStack_1c0,
             "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color."
             ,0x69);
  bufferCreateInfo._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this = &bufferCreateInfo.pNext;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Sampling from the texture with texelFetch (OpImageFetch).",0x39);
  pTVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&bufferCreateInfo,
                      (EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::endSection(pTVar9);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base(local_530);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_1c0);
  std::ios_base::~ios_base(local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_3c4,local_3c8) != &local_3b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_3c4,local_3c8),local_3b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != &local_3d8) {
    operator_delete((void *)local_3e8._0_8_,local_3d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._0_8_ != &local_618) {
    operator_delete((void *)local_628._0_8_,local_618._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._0_8_ != &local_668) {
    operator_delete((void *)local_678._0_8_,local_668._M_allocated_capacity + 1);
  }
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&bufferCreateInfo,this_00,
            (DeviceInterface *)device,(VkDevice)(ulong)caseDef->colorFormat,
            (caseDef->renderSize).m_data[0],(IVec2 *)(ulong)(uint)(caseDef->renderSize).m_data[1],
            caseDef->numLayers,caseDef->numSamples,0x14);
  local_668._M_allocated_capacity = bufferCreateInfo._16_8_;
  local_668._8_8_ = bufferCreateInfo.size;
  local_678._0_8_ = bufferCreateInfo._0_8_;
  local_678._8_8_ = bufferCreateInfo.pNext;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
            (DeviceInterface *)this_00,device,allocator,(VkImage)bufferCreateInfo._0_8_,
            (MemoryRequirement)0x0);
  local_638 = (long *)bufferCreateInfo._0_8_;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,(DeviceInterface *)this_00,
             device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_618._M_allocated_capacity = bufferCreateInfo._16_8_;
  local_618._8_8_ = bufferCreateInfo.size;
  local_628._0_8_ = bufferCreateInfo._0_8_;
  local_628._8_8_ = bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,(DeviceInterface *)this_00,
                    device,(VkCommandPool)bufferCreateInfo._0_8_);
  local_308 = bufferCreateInfo.flags;
  uStack_304 = bufferCreateInfo._20_4_;
  VStack_300 = bufferCreateInfo.size;
  local_318 = (VkCommandBuffer)bufferCreateInfo._0_8_;
  plStack_310 = (long *)bufferCreateInfo.pNext;
  pVVar2 = *(VkSubpassDescription **)(caseDef->renderSize).m_data;
  renderMultisampledImage(local_630,caseDef,(VkImage)local_678._0_8_);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = caseDef->numLayers;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&bufferCreateInfo,
                (DeviceInterface *)this_00,device,(VkImage)local_678._0_8_,
                (uint)(caseDef->numLayers != 1) * 4 + VK_IMAGE_VIEW_TYPE_2D,caseDef->colorFormat,
                subresourceRange);
  DStack_210.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_210.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_218.m_internal = bufferCreateInfo._0_8_;
  DStack_210.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.usage = 2;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_LAST;
  bufferCreateInfo.queueFamilyIndexCount = 2;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0x3f800000;
  ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)local_1c8,(DeviceInterface *)this_00,
                      device,(VkSamplerCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_238.m_internal = (deUint64)local_1c8;
  DStack_230.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  DStack_230.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_230.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&bufferCreateInfo,this_00,
            (DeviceInterface *)device,(VkDevice)0x63,(caseDef->renderSize).m_data[0],
            (IVec2 *)(ulong)(uint)(caseDef->renderSize).m_data[1],1,VK_SAMPLE_COUNT_1_BIT,0x11);
  DStack_400.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_400.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_408.m_internal = bufferCreateInfo._0_8_;
  DStack_400.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
            (DeviceInterface *)this_00,device,allocator,(VkImage)bufferCreateInfo._0_8_,
            (MemoryRequirement)0x0);
  local_640 = (long *)bufferCreateInfo._0_8_;
  res_1.aspectMask = 1;
  res_1.baseMipLevel = 0;
  res_1.levelCount = 1;
  res_1.baseArrayLayer = 0;
  res_1.layerCount = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&bufferCreateInfo,
                (DeviceInterface *)this_00,device,local_408,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_SINT
                ,subresourceRange_00);
  DStack_250.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_250.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_258.m_internal = bufferCreateInfo._0_8_;
  DStack_250.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  iVar12 = (caseDef->renderSize).m_data[1];
  iVar11 = (caseDef->renderSize).m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  iVar8 = tcu::getPixelSize(format);
  iVar8 = iVar12 * iVar11 * iVar8;
  bufferSize = (VkDeviceSize)iVar8;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c8,(DeviceInterface *)this_00,
                     device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_368.m_internal = (deUint64)local_1c8;
  DStack_360.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  DStack_360.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_360.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  local_348 = pVVar2;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
             (DeviceInterface *)this_00,device,allocator,(VkBuffer)local_1c8,(MemoryRequirement)0x1)
  ;
  uVar6 = bufferCreateInfo._0_8_;
  memset(*(void **)(bufferCreateInfo._0_8_ + 0x18),0,bufferSize);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)this_00,device,(VkDeviceMemory)*(deUint64 *)(uVar6 + 8),
             *(VkDeviceSize *)(uVar6 + 0x10),bufferSize);
  if (pipeline::(anonymous_namespace)::genFullQuadVertices()::data == '\0') {
    _GLOBAL__N_1::SampledImage::test();
  }
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,(Vertex4RGBA *)pipeline::(anonymous_namespace)::genFullQuadVertices()::data,
             (Vertex4RGBA *)&pipeline::(anonymous_namespace)::genFullQuadVertices()::data,
             (allocator_type *)&bufferCreateInfo);
  bufferSize_00 =
       (long)vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize_00,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c8,(DeviceInterface *)this_00,
                     device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_338.m_internal = (deUint64)local_1c8;
  DStack_330.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  DStack_330.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_330.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
             (DeviceInterface *)this_00,device,allocator,(VkBuffer)local_1c8,(MemoryRequirement)0x1)
  ;
  uVar7 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize_00);
  local_648 = (long *)uVar7;
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)this_00,device,(VkDeviceMemory)*(deUint64 *)(uVar7 + 8),
             *(VkDeviceSize *)(uVar7 + 0x10),bufferSize_00);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&bufferCreateInfo);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&bufferCreateInfo,
                       VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1,0x10,&local_238);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1c8,this_01,(DeviceInterface *)this_00,
             device,0);
  DStack_380.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_380.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  local_388.m_internal = (deUint64)local_1c8;
  DStack_380.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  local_1c8 = (undefined1  [8])0x0;
  pVStack_1c0 = (pointer)0x0;
  local_1b8._M_allocated_capacity = 0;
  local_1b8._8_8_ = (VkAllocationCallbacks *)0x0;
  pvVar5 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                            (int)bufferCreateInfo.pQueueFamilyIndices);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,-(long)pvVar5);
  }
  if (bufferCreateInfo.size != 0) {
    operator_delete((void *)bufferCreateInfo.size,
                    CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount) -
                    bufferCreateInfo.size);
  }
  if (bufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ - bufferCreateInfo._0_8_)
    ;
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1c8);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_1c8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
                       1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferCreateInfo,this_02,
             (DeviceInterface *)this_00,device,1,1);
  DStack_270.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_270.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_278.m_internal = bufferCreateInfo._0_8_;
  DStack_270.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity - (long)local_1c8);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferCreateInfo,
                    (DeviceInterface *)this_00,device,local_278,local_388);
  local_418 = bufferCreateInfo.flags;
  uStack_414 = bufferCreateInfo._20_4_;
  VStack_410 = bufferCreateInfo.size;
  local_428 = bufferCreateInfo._0_8_;
  plStack_420 = (long *)bufferCreateInfo.pNext;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&bufferCreateInfo);
  this_03 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&bufferCreateInfo,(VkStructureType)local_428,
                       (void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,(DeviceInterface *)this_00,device);
  pvVar5 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                            (int)bufferCreateInfo.pQueueFamilyIndices);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,-(long)pvVar5);
  }
  if (bufferCreateInfo.size != 0) {
    operator_delete((void *)bufferCreateInfo.size,
                    CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount) -
                    bufferCreateInfo.size);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&bufferCreateInfo);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)local_630->m_progCollection;
  local_1c8 = (undefined1  [8])&local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"sample_vert","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)local_1c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this_00,
             device,*(ProgramBinary **)(cVar10._M_node + 2),0);
  DStack_290.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_290.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_298.m_internal = bufferCreateInfo._0_8_;
  DStack_290.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)local_630->m_progCollection;
  local_1c8 = (undefined1  [8])&local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"sample_frag","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)local_1c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this_00,
             device,*(ProgramBinary **)(cVar10._M_node + 2),0);
  uVar7 = bufferCreateInfo._0_8_;
  DStack_2b0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_2b0.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  DStack_2b0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
  local_3e8._0_8_ = (pointer)0x6300000000;
  local_3e8._8_8_ = (PFN_vkAllocationFunction)0x100000001;
  local_3d8._M_allocated_capacity = 0x200000000;
  local_3d8._8_8_ = 1;
  local_3c8 = 2;
  bufferCreateInfo._32_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.size = 1;
  local_1c8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  pVStack_1c0 = (pointer)0x0;
  local_1b8._M_allocated_capacity = 0x100000000;
  local_1b8._8_8_ = local_3e8;
  local_1a8._0_4_ = 1;
  local_198 = 0;
  local_190 = (VkSubpassDependency *)0x0;
  local_1a0 = (VkSubpassDescription *)&bufferCreateInfo;
  ::vk::createRenderPass
            (&local_5c8,(DeviceInterface *)this_00,device,(VkRenderPassCreateInfo *)local_1c8,
             (VkAllocationCallbacks *)0x0);
  local_3a8.m_internal =
       local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  DStack_3a0.m_deviceIface =
       local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  DStack_3a0.m_device =
       local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_3a0.m_allocator =
       local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo,
                  (DeviceInterface *)this_00,device,
                  (VkRenderPass)
                  local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
                  1,&local_258,(caseDef->renderSize).m_data[0],(caseDef->renderSize).m_data[1],1);
  local_3d8._M_allocated_capacity = bufferCreateInfo._16_8_;
  local_3d8._8_8_ = bufferCreateInfo.size;
  local_3e8._0_8_ = bufferCreateInfo._0_8_;
  local_3e8._8_8_ = bufferCreateInfo.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,
                     (DeviceInterface *)this_00,device,local_388);
  local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  fragmentModule.m_internal._4_4_ = 0;
  fragmentModule.m_internal._0_4_ = (caseDef->renderSize).m_data[0];
  renderSize.m_data[1] = 0;
  renderSize.m_data[0] = (caseDef->renderSize).m_data[1];
  makeGraphicsPipelines
            (&pipelines,this_00,(DeviceInterface *)device,(VkDevice)&DAT_00000001,
             bufferCreateInfo.sType,local_3a8,local_298,(VkShaderModule)uVar7,fragmentModule,
             renderSize,VK_SAMPLE_COUNT_1_BIT,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP);
  commandBuffer = local_318;
  beginCommandBuffer((DeviceInterface *)this_00,local_318);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  bufferCreateInfo._20_4_ = 0x20;
  bufferCreateInfo.size = 0x500000002;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = (deUint32)local_678._0_8_;
  bufferCreateInfo._44_4_ = SUB84(local_678._0_8_,4);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  (**(code **)(*(long *)this_00 + 0x368))
            (this_00,commandBuffer,0x400,0x80,0,0,0,0,0,1,(int)&bufferCreateInfo);
  local_190 = (VkSubpassDependency *)&local_48;
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  uStack_40._0_4_ = 0;
  uStack_40._4_4_ = 0;
  local_1c8._0_4_ = 0x2b;
  pVStack_1c0 = (pointer)0x0;
  local_1b8._M_allocated_capacity = local_3a8.m_internal;
  local_1b8._8_8_ = local_3e8._0_8_;
  local_1a8 = 0;
  local_1a0 = local_348;
  local_198 = 1;
  (**(code **)(*(long *)this_00 + 0x3a0))(this_00,commandBuffer,local_1c8,0);
  (**(code **)(*(long *)this_00 + 0x260))
            (this_00,commandBuffer,0,
             ((pipelines.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (**(code **)(*(long *)this_00 + 0x2b0))
            (this_00,commandBuffer,0,
             local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,0,1,
             (int)&local_428,0,0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  (**(code **)(*(long *)this_00 + 0x2c0))(this_00,commandBuffer,0,1);
  (**(code **)(*(long *)this_00 + 0x2c8))
            (this_00,commandBuffer,
             (ulong)((long)vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5,1);
  (**(code **)(*(long *)this_00 + 0x3b0))(this_00,commandBuffer);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  bufferCreateInfo._20_4_ = 0x800;
  bufferCreateInfo.size = 0x600000002;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = (deUint32)local_408.m_internal;
  bufferCreateInfo._44_4_ = SUB84(local_408.m_internal >> 0x20,0);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  uVar14 = SUB84(&bufferCreateInfo,0);
  (**(code **)(*(long *)this_00 + 0x368))(this_00,commandBuffer,0x400,0x1000,0,0,0,0,0,1,uVar14);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 1;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0x100000000;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  uVar4 = *(undefined8 *)(caseDef->renderSize).m_data;
  bufferCreateInfo._44_4_ = SUB84(uVar4,0);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = (int)((ulong)uVar4 >> 0x20);
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 1;
  (**(code **)(*(long *)this_00 + 0x318))
            (this_00,commandBuffer,local_408.m_internal,6,local_368.m_internal,1,uVar14);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x1000;
  bufferCreateInfo._20_4_ = 0x2000;
  bufferCreateInfo.size = 0xffffffffffffffff;
  bufferCreateInfo.usage = (undefined4)local_368.m_internal;
  bufferCreateInfo.sharingMode = local_368.m_internal._4_4_;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = iVar8 >> 0x1f;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = iVar8;
  (**(code **)(*(long *)this_00 + 0x368))(this_00,commandBuffer,0x1000,0x4000,0,0,0,1,uVar14,0,0);
  result = (**(code **)(*(long *)this_00 + 0x250))(this_00,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x465);
  submitCommandsAndWait((DeviceInterface *)this_00,device,local_340,commandBuffer);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)this_00,device,(VkDeviceMemory)*(deUint64 *)(uVar6 + 8),0,bufferSize
            );
  colorAttachmentRef = (VkAttachmentReference)::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&bufferCreateInfo,(TextureFormat *)&colorAttachmentRef,
             (caseDef->renderSize).m_data[0],(caseDef->renderSize).m_data[1],1,
             *(void **)(uVar6 + 0x18));
  iVar12 = (caseDef->renderSize).m_data[1];
  iVar11 = 0;
  pTVar13 = local_650;
  if (0 < iVar12) {
    iVar8 = caseDef->numLayers;
    VVar1 = caseDef->numSamples;
    do {
      if (0 < (caseDef->renderSize).m_data[0]) {
        iVar12 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&colorAttachmentRef,(int)&bufferCreateInfo,iVar12,
                     iVar11);
          if (colorAttachmentRef.attachment != iVar8 * VVar1) {
            colorAttachmentRef = (VkAttachmentReference)local_5d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&colorAttachmentRef,"Some samples have incorrect color","");
            pTVar13 = local_650;
            local_650->m_code = QP_TEST_RESULT_FAIL;
            (local_650->m_description)._M_dataplus._M_p =
                 (pointer)&(local_650->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_650->m_description,colorAttachmentRef,
                       local_5e0 + (long)colorAttachmentRef);
            if (colorAttachmentRef != (VkAttachmentReference)local_5d8) {
              operator_delete((void *)colorAttachmentRef,local_5d8[0] + 1);
            }
            iVar11 = 1;
            goto LAB_004c0de4;
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < (caseDef->renderSize).m_data[0]);
        iVar12 = (caseDef->renderSize).m_data[1];
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar12);
    iVar11 = 0;
    pTVar13 = local_650;
  }
LAB_004c0de4:
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipelines);
  if (local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
               &local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkPipelineLayout)
               local_5c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_3e8 + 8),
               (VkFramebuffer)local_3e8._0_8_);
  }
  if (local_3a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_3a0,(VkRenderPass)local_3a8.m_internal);
  }
  if (uVar7 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_2b0,(VkShaderModule)uVar7);
  }
  if (local_298.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_290,(VkShaderModule)local_298.m_internal);
  }
  if (local_428 != 0) {
    bufferCreateInfo._0_8_ = local_428;
    (**(code **)(*plStack_420 + 0x1e8))(plStack_420,_local_418,VStack_410,1);
  }
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_270,local_278);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_380,local_388);
  }
  if (local_648 != (long *)0x0) {
    (**(code **)(*local_648 + 8))();
  }
  if (local_338.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_330,local_338);
  }
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (uVar6 != 0) {
    (**(code **)(*(long *)uVar6 + 8))(uVar6);
  }
  if (local_368.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_360,local_368);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_250,local_258);
  }
  if (local_640 != (long *)0x0) {
    (**(code **)(*local_640 + 8))();
  }
  if (local_408.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_400,local_408);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()(&DStack_230,local_238);
  }
  if (local_218.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_210,local_218);
  }
  if ((char)iVar11 == '\0') {
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"OK","");
    pTVar13->m_code = QP_TEST_RESULT_PASS;
    (pTVar13->m_description)._M_dataplus._M_p = (pointer)&(pTVar13->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar13->m_description,bufferCreateInfo._0_8_,
               (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
    if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
      operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
    }
  }
  if (commandBuffer != (VkCommandBuffer)0x0) {
    bufferCreateInfo._0_8_ = commandBuffer;
    (**(code **)(*plStack_310 + 0x240))(plStack_310,_local_308,VStack_300,1);
  }
  if ((pointer)local_628._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_628 + 8),
               (VkCommandPool)local_628._0_8_);
  }
  if (local_638 != (long *)0x0) {
    (**(code **)(*local_638 + 8))();
  }
  if ((pointer)local_678._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_678 + 8),(VkImage)local_678._0_8_);
  }
  return pTVar13;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkDevice				device				= context.getDevice();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	const VkImageUsageFlags		colorImageUsage		= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_SAMPLED_BIT;

	checkImageFormatRequirements(vki, physDevice, caseDef.numSamples, caseDef.colorFormat, colorImageUsage);

	{
		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogSection("Description", "")
			<< tcu::TestLog::Message << "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Sampling from the texture with texelFetch (OpImageFetch)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::EndSection;
	}

	// Multisampled color image
	const Unique<VkImage>			colorImage		(makeImage(vk, device, caseDef.colorFormat, caseDef.renderSize, caseDef.numLayers, caseDef.numSamples, colorImageUsage));
	const UniquePtr<Allocation>		colorImageAlloc	(bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any));

	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	// Step 1: Render to texture
	{
		renderMultisampledImage(context, caseDef, *colorImage);
	}

	// Step 2: Sample texture
	{
		// Color image view
		const VkImageViewType			colorImageViewType	= (caseDef.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
		const Unique<VkImageView>		colorImageView		(makeImageView(vk, device, *colorImage, colorImageViewType, caseDef.colorFormat, makeColorSubresourceRange(0, caseDef.numLayers)));
		const Unique<VkSampler>			colorSampler		(makeSampler(vk, device));

		// Checksum image
		const VkFormat					checksumFormat		= VK_FORMAT_R32_SINT;
		const Unique<VkImage>			checksumImage		(makeImage(vk, device, checksumFormat, caseDef.renderSize, 1u, VK_SAMPLE_COUNT_1_BIT,
																	   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
		const UniquePtr<Allocation>		checksumImageAlloc	(bindImage(vk, device, allocator, *checksumImage, MemoryRequirement::Any));
		const Unique<VkImageView>		checksumImageView	(makeImageView(vk, device, *checksumImage, VK_IMAGE_VIEW_TYPE_2D, checksumFormat, makeColorSubresourceRange(0, 1)));

		// Checksum buffer (for host reading)
		const VkDeviceSize				checksumBufferSize	= caseDef.renderSize.x() * caseDef.renderSize.y() * tcu::getPixelSize(mapVkFormat(checksumFormat));
		const Unique<VkBuffer>			checksumBuffer		(makeBuffer(vk, device, checksumBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
		const UniquePtr<Allocation>		checksumBufferAlloc	(bindBuffer(vk, device, allocator, *checksumBuffer, MemoryRequirement::HostVisible));

		zeroBuffer(vk, device, *checksumBufferAlloc, checksumBufferSize);

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genFullQuadVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Descriptors
		// \note OpImageFetch doesn't use a sampler, but in GLSL texelFetch needs a sampler2D which translates to a combined image sampler in Vulkan.

		const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
			.addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_FRAGMENT_BIT, &colorSampler.get())
			.build(vk, device));

		const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
			.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

		const Unique<VkDescriptorSet>	descriptorSet		(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
		const VkDescriptorImageInfo		imageDescriptorInfo	= makeDescriptorImageInfo(DE_NULL, *colorImageView, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);

		DescriptorSetUpdateBuilder()
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageDescriptorInfo)
			.update(vk, device);

		const Unique<VkShaderModule>	vertexModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeSimpleRenderPass	(vk, device, checksumFormat));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer		(vk, device, *renderPass, 1u, &checksumImageView.get(),
																				 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout		(vk, device, *descriptorSetLayout));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines	(vk, device, 1u, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																				 caseDef.renderSize, VK_SAMPLE_COUNT_1_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP));

		beginCommandBuffer(vk, *cmdBuffer);

		// Prepare for sampling in the fragment shader
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_SHADER_READ_BIT,									// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,					// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*colorImage,												// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers),			// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		const VkClearValue clearValue = makeClearValueColorU32(0u, 0u, 0u, 0u);

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,							// VkStructureType         sType;
			DE_NULL,															// const void*             pNext;
			*renderPass,														// VkRenderPass            renderPass;
			*framebuffer,														// VkFramebuffer           framebuffer;
			renderArea,															// VkRect2D                renderArea;
			1u,																	// uint32_t                clearValueCount;
			&clearValue,														// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines.back());
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*cmdBuffer);

		// Prepare checksum image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*checksumImage,												// VkImage					image;
					makeColorSubresourceRange(0, 1),							// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Checksum image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeColorSubresourceLayers(0, 1),											// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.renderSize.x(), caseDef.renderSize.y(), 1u),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *checksumBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					*checksumBuffer,								// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					checksumBufferSize,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify result

		{
			invalidateMappedMemoryRange(vk, device, checksumBufferAlloc->getMemory(), 0ull, checksumBufferSize);

			const tcu::ConstPixelBufferAccess access(mapVkFormat(checksumFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), 1, checksumBufferAlloc->getHostPtr());
			const int numExpectedChecksum = getNumSamples(caseDef.numSamples) * caseDef.numLayers;

			for (int y = 0; y < caseDef.renderSize.y(); ++y)
			for (int x = 0; x < caseDef.renderSize.x(); ++x)
			{
				if (access.getPixelInt(x, y).x() != numExpectedChecksum)
					return tcu::TestStatus::fail("Some samples have incorrect color");
			}
		}
	}

	return tcu::TestStatus::pass("OK");
}